

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O3

int biseqcstrcaseless(bstring b,char *s)

{
  byte bVar1;
  byte bVar2;
  uchar *puVar3;
  __int32_t **pp_Var4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  
  uVar7 = 0xffffffff;
  if (((s != (char *)0x0 && b != (bstring)0x0) &&
      (puVar3 = b->data, uVar7 = 0xffffffff, puVar3 != (uchar *)0x0)) &&
     (uVar8 = (ulong)(uint)b->slen, -1 < b->slen)) {
    if (uVar8 == 0) {
      uVar8 = 0;
    }
    else {
      uVar6 = 0;
      do {
        bVar1 = s[uVar6];
        uVar5 = (ulong)bVar1;
        if (uVar5 == 0) {
          return 0;
        }
        bVar2 = puVar3[uVar6];
        uVar7 = (uint)bVar2;
        if (bVar2 != bVar1) {
          if (-1 < (char)bVar2) {
            pp_Var4 = __ctype_tolower_loc();
            uVar7 = (*pp_Var4)[bVar2];
          }
          if (-1 < (char)bVar1) {
            pp_Var4 = __ctype_tolower_loc();
            uVar5 = (ulong)*(byte *)(*pp_Var4 + uVar5);
          }
          if (uVar7 != (uint)uVar5) {
            return 0;
          }
        }
        uVar6 = uVar6 + 1;
      } while (uVar8 != uVar6);
    }
    uVar7 = (uint)(s[uVar8] == '\0');
  }
  return uVar7;
}

Assistant:

int biseqcstrcaseless (const bstring b, const char * s) {
int i;
	if (b == NULL || s == NULL || b->data == NULL || b->slen < 0) return BSTR_ERR;
	for (i=0; i < b->slen; i++) {
		if (s[i] == '\0' || 
		    (b->data[i] != (unsigned char) s[i] && 
		     downcase (b->data[i]) != (unsigned char) downcase (s[i])))
			return 0;
	}
	return s[i] == '\0';
}